

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add_compressed
                    (nk_font_atlas *atlas,void *compressed_data,nk_size compressed_size,float height
                    ,nk_font_config *config)

{
  void *in_RCX;
  uchar *in_RSI;
  long in_RDI;
  undefined4 in_XMM0_Da;
  nk_font_config cfg;
  void *decompressed_data;
  uint decompressed_size;
  uint in_stack_ffffffffffffff0c;
  uchar *in_stack_ffffffffffffff10;
  uchar *in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff24;
  nk_font_config *in_stack_ffffffffffffff30;
  nk_font_atlas *in_stack_ffffffffffffff38;
  undefined1 local_98 [8];
  long local_90;
  ulong local_88;
  undefined1 local_80;
  undefined4 local_78;
  long local_40;
  uint local_34;
  void *local_30;
  undefined4 local_24;
  long local_10;
  nk_font *local_8;
  
  if ((((in_RDI == 0) || (in_RSI == (uchar *)0x0)) || (*(long *)(in_RDI + 0x30) == 0)) ||
     (((*(long *)(in_RDI + 0x38) == 0 || (*(long *)(in_RDI + 0x18) == 0)) ||
      (*(long *)(in_RDI + 0x20) == 0)))) {
    local_8 = (nk_font *)0x0;
  }
  else {
    local_30 = in_RCX;
    local_24 = in_XMM0_Da;
    local_10 = in_RDI;
    local_34 = nk_decompress_length(in_RSI);
    local_40 = (**(code **)(local_10 + 0x18))(*(undefined8 *)(local_10 + 0x10),0,local_34);
    if (local_40 == 0) {
      local_8 = (nk_font *)0x0;
    }
    else {
      nk_decompress(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
      if (local_30 == (void *)0x0) {
        nk_font_config(in_stack_ffffffffffffff24);
        memcpy(local_98,&stack0xffffffffffffff10,0x58);
      }
      else {
        memcpy(local_98,local_30,0x58);
      }
      local_90 = local_40;
      local_88 = (ulong)local_34;
      local_78 = local_24;
      local_80 = 1;
      local_8 = nk_font_atlas_add(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    }
  }
  return local_8;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed(struct nk_font_atlas *atlas,
void *compressed_data, nk_size compressed_size, float height,
const struct nk_font_config *config)
{
unsigned int decompressed_size;
void *decompressed_data;
struct nk_font_config cfg;

NK_ASSERT(atlas);
NK_ASSERT(atlas->temporary.alloc);
NK_ASSERT(atlas->temporary.free);
NK_ASSERT(atlas->permanent.alloc);
NK_ASSERT(atlas->permanent.free);

NK_ASSERT(compressed_data);
NK_ASSERT(compressed_size);
if (!atlas || !compressed_data || !atlas->temporary.alloc || !atlas->temporary.free ||
!atlas->permanent.alloc || !atlas->permanent.free)
return 0;

decompressed_size = nk_decompress_length((unsigned char*)compressed_data);
decompressed_data = atlas->permanent.alloc(atlas->permanent.userdata,0,decompressed_size);
NK_ASSERT(decompressed_data);
if (!decompressed_data) return 0;
nk_decompress((unsigned char*)decompressed_data, (unsigned char*)compressed_data,
(unsigned int)compressed_size);

cfg = (config) ? *config: nk_font_config(height);
cfg.ttf_blob = decompressed_data;
cfg.ttf_size = decompressed_size;
cfg.size = height;
cfg.ttf_data_owned_by_atlas = 1;
return nk_font_atlas_add(atlas, &cfg);
}